

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3843::Calc_Sxi_D
          (ChElementHexaANCF_3843 *this,MatrixNx3c *Sxi_D,double xi,double eta,double zeta)

{
  VectorN Sxi_D_col;
  BlockImpl_dense<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true,_true> local_1b0;
  VectorN local_180;
  
  Calc_Sxi_xi_compact(this,&local_180,xi,eta,zeta);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true,_true>::
  BlockImpl_dense(&local_1b0,Sxi_D,0);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,32,3,0,32,3>,32,1,true>,Eigen::Matrix<double,32,1,0,32,1>>
            ((Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true> *)&local_1b0,&local_180);
  Calc_Sxi_eta_compact(this,&local_180,xi,eta,zeta);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true,_true>::
  BlockImpl_dense(&local_1b0,Sxi_D,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,32,3,0,32,3>,32,1,true>,Eigen::Matrix<double,32,1,0,32,1>>
            ((Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true> *)&local_1b0,&local_180);
  Calc_Sxi_zeta_compact(this,&local_180,xi,eta,zeta);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true,_true>::
  BlockImpl_dense(&local_1b0,Sxi_D,2);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,32,3,0,32,3>,32,1,true>,Eigen::Matrix<double,32,1,0,32,1>>
            ((Block<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_32,_1,_true> *)&local_1b0,&local_180);
  return;
}

Assistant:

void ChElementHexaANCF_3843::Calc_Sxi_D(MatrixNx3c& Sxi_D, double xi, double eta, double zeta) {
    VectorN Sxi_D_col;
    Calc_Sxi_xi_compact(Sxi_D_col, xi, eta, zeta);
    Sxi_D.col(0) = Sxi_D_col;

    Calc_Sxi_eta_compact(Sxi_D_col, xi, eta, zeta);
    Sxi_D.col(1) = Sxi_D_col;

    Calc_Sxi_zeta_compact(Sxi_D_col, xi, eta, zeta);
    Sxi_D.col(2) = Sxi_D_col;
}